

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AsmJsModule.cpp
# Opt level: O0

void __thiscall Js::AsmJsModuleCompiler::InitMemoryOffsets(AsmJsModuleCompiler *this)

{
  int iVar1;
  RegSlot RVar2;
  int iVar3;
  int32 iVar4;
  AsmJsModuleCompiler *this_local;
  
  (this->mModuleMemory).mArrayBufferOffset = 0;
  (this->mModuleMemory).mStdLibOffset = (this->mModuleMemory).mArrayBufferOffset + 1;
  (this->mModuleMemory).mDoubleOffset = (this->mModuleMemory).mStdLibOffset + 1;
  iVar1 = (this->mModuleMemory).mDoubleOffset;
  RVar2 = WAsmJs::RegisterSpace::GetTotalVarCount(&this->mDoubleVarSpace);
  (this->mModuleMemory).mFuncOffset = iVar1 + RVar2;
  iVar1 = (this->mModuleMemory).mFuncOffset;
  iVar3 = JsUtil::ReadOnlyList<Js::AsmJsFunc_*,_Memory::ArenaAllocator,_DefaultComparer>::Count
                    (&(this->mFunctionArray).
                      super_ReadOnlyList<Js::AsmJsFunc_*,_Memory::ArenaAllocator,_DefaultComparer>);
  (this->mModuleMemory).mFFIOffset = iVar1 + iVar3;
  iVar1 = (this->mModuleMemory).mFFIOffset;
  RVar2 = WAsmJs::RegisterSpace::GetTotalVarCount(&this->mImportFunctions);
  (this->mModuleMemory).mFuncPtrOffset = iVar1 + RVar2;
  iVar1 = (this->mModuleMemory).mFuncPtrOffset;
  iVar4 = GetFuncPtrTableCount(this);
  (this->mModuleMemory).mFloatOffset = iVar1 + iVar4;
  iVar1 = (this->mModuleMemory).mFloatOffset;
  RVar2 = WAsmJs::RegisterSpace::GetTotalVarCount(&this->mFloatVarSpace);
  (this->mModuleMemory).mIntOffset = iVar1 + (int)((double)RVar2 * 0.5 + 0.5);
  iVar1 = (this->mModuleMemory).mIntOffset;
  RVar2 = WAsmJs::RegisterSpace::GetTotalVarCount(&this->mIntVarSpace);
  (this->mModuleMemory).mMemorySize = iVar1 + (int)((double)RVar2 * 0.5 + 0.5);
  return;
}

Assistant:

void AsmJsModuleCompiler::InitMemoryOffsets()
    {
        mModuleMemory.mArrayBufferOffset = AsmJsModuleMemory::MemoryTableBeginOffset;
        mModuleMemory.mStdLibOffset = mModuleMemory.mArrayBufferOffset + 1;
        mModuleMemory.mDoubleOffset = mModuleMemory.mStdLibOffset + 1;
        mModuleMemory.mFuncOffset = mModuleMemory.mDoubleOffset + (mDoubleVarSpace.GetTotalVarCount() * WAsmJs::DOUBLE_SLOTS_SPACE);
        mModuleMemory.mFFIOffset = mModuleMemory.mFuncOffset + mFunctionArray.Count();
        mModuleMemory.mFuncPtrOffset = mModuleMemory.mFFIOffset + mImportFunctions.GetTotalVarCount();
        mModuleMemory.mFloatOffset = mModuleMemory.mFuncPtrOffset + GetFuncPtrTableCount();
        mModuleMemory.mIntOffset = mModuleMemory.mFloatOffset + (int32)(mFloatVarSpace.GetTotalVarCount() * WAsmJs::FLOAT_SLOTS_SPACE + 0.5);
        mModuleMemory.mMemorySize = mModuleMemory.mIntOffset + (int32)(mIntVarSpace.GetTotalVarCount() * WAsmJs::INT_SLOTS_SPACE + 0.5);
    }